

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_Message(FParser *this)

{
  AActor *pAVar1;
  bool bVar2;
  char *in_RAX;
  FString local_18;
  
  if (0 < this->t_argc) {
    pAVar1 = (this->Script->trigger).field_0.p;
    if (pAVar1 != (AActor *)0x0) {
      if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        local_18.Chars = in_RAX;
        bVar2 = AActor::CheckLocalView((this->Script->trigger).field_0.p,consoleplayer);
        if (bVar2) {
          GetFormatString((FParser *)&stack0xffffffffffffffe8,(int)this);
          Printf(2,"%s\n",local_18.Chars);
          FString::~FString(&stack0xffffffffffffffe8);
        }
      }
      else {
        (this->Script->trigger).field_0.p = (AActor *)0x0;
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_Message(void)
{
	if (t_argc>0 && Script->trigger &&
		Script->trigger->CheckLocalView(consoleplayer))
	{
		Printf(PRINT_HIGH, "%s\n", GetFormatString(0).GetChars());
	}
}